

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall
glslang::TDefaultGlslIoResolver::beginCollect(TDefaultGlslIoResolver *this,EShLanguage stage)

{
  if (stage == EShLangCount) {
    this->preStage = EShLangCount;
    this->currentStage = EShLangCount;
    return;
  }
  if (this->currentStage != stage) {
    this->preStage = this->currentStage;
    this->currentStage = stage;
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::beginCollect(EShLanguage stage) {
    // reset stage state
    if (stage == EShLangCount)
        preStage = currentStage = stage;
    // update stage state
    else if (currentStage != stage) {
        preStage = currentStage;
        currentStage = stage;
    }
}